

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

double __thiscall
NEST::NESTcalc::PhotonTime
          (NESTcalc *this,INTERACTION_TYPE species,bool exciton,double dfield,double energy)

{
  bool bVar1;
  RandomGen *pRVar2;
  double dVar3;
  double dVar4;
  double LET;
  double tau1;
  double tau3;
  double tauR;
  double SingTripRatio;
  double time_ns;
  double energy_local;
  double dfield_local;
  bool exciton_local;
  INTERACTION_TYPE species_local;
  NESTcalc *this_local;
  
  tau3 = 0.0;
  tau1 = 23.97;
  LET = 3.27;
  bVar1 = VDetector::get_inGas(this->fdetector);
  if ((bVar1) || (energy < 0.0134)) {
    LET = 5.18;
    tau1 = 100.1;
  }
  CalcElectronLET(this,energy,0x36,true);
  bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  time_ns = energy;
  if (bVar1) {
    pRVar2 = RandomGen::rndm();
    LET = RandomGen::rand_gauss(pRVar2,6.0,0.8,true);
    pRVar2 = RandomGen::rndm();
    tau1 = RandomGen::rand_gauss(pRVar2,1500.0,50.0,true);
    tau3 = 0.0;
    if ((int)species < 6) {
      dVar3 = pow(energy / 41.78474,1.954878);
      tauR = -1.5948417 / (dVar3 + 1.0) + 2.585833;
      pRVar2 = RandomGen::rndm();
      dVar3 = exp(dfield * -0.0066332);
      tau3 = RandomGen::rand_gauss(pRVar2,dVar3 * 57.6539,0.2,true);
    }
    else if (species == ion) {
      dVar3 = exp(-energy / 1000.0);
      dVar4 = pow(energy / 1000.0,2.0);
      tauR = (dVar3 * 1.9996 + -0.065492) / (0.082154 / dVar4 + 1.0) + 2.1811;
    }
    else {
      dVar3 = pow(energy / 5.021868,1.426286);
      tauR = 0.6818562 / (dVar3 + 1.0) + 0.3039284;
      pRVar2 = RandomGen::rndm();
      dVar3 = exp(dfield * -0.0066332);
      tau3 = RandomGen::rand_gauss(pRVar2,dVar3 * 314.014,0.2,true);
    }
  }
  else if ((int)species < 6) {
    tauR = 0.269;
    if (exciton) {
      tau3 = 0.5;
    }
  }
  else if (species == ion) {
    dVar3 = pow(energy,0.416);
    tauR = dVar3 * 0.065;
  }
  else {
    tau1 = 25.89;
    if (exciton) {
      tau3 = 0.0;
    }
    else {
      if (1000.0 < energy) {
        time_ns = 1000.0;
      }
      dVar3 = exp(dfield * -0.009);
      dVar4 = log10(time_ns);
      tau3 = dVar3 * (dVar4 * 3.8431 + 7.3138);
    }
    tauR = 0.042;
  }
  bVar1 = VDetector::get_inGas(this->fdetector);
  if ((bVar1) || (time_ns < 0.0134)) {
    tauR = 0.1;
    bVar1 = VDetector::get_inGas(this->fdetector);
    if ((!bVar1) || (exciton)) {
      tau3 = 0.0;
    }
    else {
      tau3 = 28000.0;
    }
    bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
    if (bVar1) {
      tau1 = 1600.0;
      LET = 6.0;
    }
  }
  if (tau3 < 0.0) {
    tau3 = 0.0;
  }
  pRVar2 = RandomGen::rndm();
  dVar3 = RandomGen::rand_uniform(pRVar2);
  pRVar2 = RandomGen::rndm();
  dVar4 = RandomGen::rand_uniform(pRVar2);
  if (tauR / (tauR + 1.0) <= dVar4) {
    pRVar2 = RandomGen::rndm();
    dVar4 = RandomGen::rand_uniform(pRVar2);
    dVar4 = log(dVar4);
    dVar4 = -tau1 * dVar4;
  }
  else {
    pRVar2 = RandomGen::rndm();
    dVar4 = RandomGen::rand_uniform(pRVar2);
    dVar4 = log(dVar4);
    dVar4 = -LET * dVar4;
  }
  SingTripRatio = dVar4 + tau3 * (1.0 / dVar3 - 1.0) + 0.0;
  return SingTripRatio;
}

Assistant:

double NESTcalc::PhotonTime(INTERACTION_TYPE species, bool exciton,
                            double dfield, double energy) {
  double time_ns = 0., SingTripRatio = 0., tauR = 0., tau3 = 23.97,
         tau1 =
             3.27;  // arXiv:1802.06162. NR may need tauR ~0.5-1ns instead of 0
  if (fdetector->get_inGas() || energy < W_DEFAULT * 0.001) {
    // from G4S1Light.cc in old NEST
    tau1 = 5.18;   // uncertainty of 1.55 ns from G4S2Light
    tau3 = 100.1;  // uncertainty of 7.90 ns from G4S2Light
  }
  // tau1 = 3.5*ns; tau3 = 20.*ns; tauR = 40.*ns for solid Xe from old NEST.
  // Here assuming same as in liquid

  // if ( dfield > 60. ) dfield = 60. // makes Xed work. 200 for LUX Run04
  // instead. A mystery! Why no field dep?

  double LET = CalcElectronLET(energy, ATOM_NUM);
  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.)) {
    // copied from 2013 NEST version for LAr on LBNE
    tau1 = RandomGen::rndm()->rand_gauss(6, 0.8,
                                         true);  // error from weighted average
    tau3 = RandomGen::rndm()->rand_gauss(1500, 50, true);  // ibid.
    tauR = 0;
    if (species <= Cf) {
      SingTripRatio =(2.585833+(0.9909913-2.585833)/(1+pow(energy/41.78474, 1.954878)));
      tauR = RandomGen::rndm()->rand_gauss(57.6539*exp(-0.0066332*dfield), 0.2, true);
      }
    else if (species == ion) {  // really only alphas here
      SingTripRatio = (-0.065492 + 1.9996 * exp(-energy / 1e3)) /
                          (1. + 0.082154 / pow(energy / 1e3, 2.)) +
                      2.1811;  // uses energy in MeV not keV
    } else {
      SingTripRatio = 0.3039284 + (0.9857846 - 0.3039284)/(1 + pow((energy/5.021868),1.426286)); 
      tauR = RandomGen::rndm()->rand_gauss(314.014*exp(-0.0066332*dfield), 0.2, true);
    }  // lastly is ER for LAr
  } else {
    if (species <= Cf) {  // NR
      SingTripRatio = 0.269; if (exciton) tauR = 0.5;
    }
    else if (species == ion) {
      // e.g., alphas
      SingTripRatio =
          0.065 *
          pow(energy,
              0.416);  // spans 2.3 (alpha) and 7.8 (Cf in Xe) from NEST v1
    } else {
      tau3 = 25.89;  // ER
      if (!exciton) {
        if (energy > 1e3)
          energy = 1e3;  // MIP above ~1 MeV. Fix thanks to Austin de St. Croix
        tauR = exp(-0.00900 * dfield) *
               (7.3138 + 3.8431 * log10(energy));  // arXiv:1310.1117
        //if (tauR < 3.5) tauR = 3.5;  // gammas?
        if (dfield > 8e2) dfield = 8e2;  // to match Kubota's 4,000 V/cm
        SingTripRatio = 0.042;
      } else {
        SingTripRatio = 0.042; tauR = 0.;
      }
    }
  }
  if (fdetector->get_inGas() || energy < W_DEFAULT * 0.001) {
    SingTripRatio = 0.1;
    if (fdetector->get_inGas() && !exciton)
      tauR = 28e3;
    else {
      tauR = 0.;  // 28 microseconds comes from Henrique:
                  // https://doi.org/10.1016/j.astropartphys.2018.04.006
    }
    if (ValidityTests::nearlyEqual(ATOM_NUM, 18.)) {
      tau3 = 1600.;
      tau1 = 6.;
    }  // from old G4S2Light
  }
  if (tauR < 0.) tauR = 0.;  // in case varied with Gaussian earlier

  // the recombination time is non-exponential, but approximates
  // to exp at long timescales (see Kubota '79)
   time_ns += tauR * (1.0 / RandomGen::rndm()->rand_uniform() - 1.);

  if (RandomGen::rndm()->rand_uniform() < SingTripRatio / (1. + SingTripRatio))
    time_ns -= tau1 * log(RandomGen::rndm()->rand_uniform());
  else {
    time_ns -= tau3 * log(RandomGen::rndm()->rand_uniform());
  }

  return time_ns;
}